

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-map-type.cpp
# Opt level: O3

Up __thiscall yactfr::FixedLengthBitMapType::_clone(FixedLengthBitMapType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var1;
  BitOrder local_48;
  ByteOrder local_44;
  uint local_40;
  uint local_3c;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_38;
  undefined1 local_30 [8];
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_28;
  
  local_3c = *(uint *)(in_RSI + 0xc);
  local_40 = *(uint *)(in_RSI + 0x18);
  local_44 = *(ByteOrder *)(in_RSI + 0x1c);
  local_48 = *(BitOrder *)(in_RSI + 0x20);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    _Var1._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffd8,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    _Var1._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffd8);
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       _Var1._M_head_impl;
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((FixedLengthBitMapType *)local_30,&local_3c,&local_40,&local_44,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)(in_RSI + 0x28),&local_48,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)local_30;
  local_30 = (undefined1  [8])0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBitMapType::_clone() const
{
    return FixedLengthBitMapType::create(this->alignment(), this->length(), this->byteOrder(),
                                         _flags, this->bitOrder(),
                                         internal::tryCloneAttrs(this->attributes()));
}